

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O1

LY_ERR lyb_parse_prefix_data(lylyb_ctx *lybctx,LY_VALUE_FORMAT format,void **prefix_data)

{
  LY_ERR LVar1;
  LY_ERR LVar2;
  char **str;
  byte bVar3;
  uint8_t count;
  ly_set *set;
  byte local_39;
  ly_set *local_38;
  
  local_38 = (ly_set *)0x0;
  if (format - LY_VALUE_JSON < 2) {
LAB_0013aa63:
    LVar1 = LY_SUCCESS;
  }
  else {
    if (format != LY_VALUE_XML) {
      str = (char **)0x0;
      LVar1 = LY_EINT;
      ly_log(lybctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c",
             0x25c);
      goto LAB_0013aaca;
    }
    lyb_read(&local_39,1,lybctx);
    LVar1 = ly_set_new(&local_38);
    if (LVar1 == LY_SUCCESS) {
      if (local_39 != 0) {
        bVar3 = 0;
        do {
          str = (char **)calloc(1,0x18);
          LVar2 = lyb_read_string(str,'\x02',lybctx);
          LVar1 = LY_EMEM;
          if (LVar2 != LY_SUCCESS) goto LAB_0013aaca;
          if (**str == '\0') {
            free(*str);
            *str = (char *)0x0;
          }
          LVar2 = lyb_read_string(str + 1,'\x02',lybctx);
          if ((LVar2 != LY_SUCCESS) ||
             (LVar1 = ly_set_add(local_38,str,'\x01',(uint32_t *)0x0), LVar1 != LY_SUCCESS))
          goto LAB_0013aaca;
          bVar3 = bVar3 + 1;
        } while (bVar3 < local_39);
      }
      *prefix_data = local_38;
      goto LAB_0013aa63;
    }
  }
  str = (char **)0x0;
LAB_0013aaca:
  if ((LVar1 != LY_SUCCESS) && (ly_free_prefix_data(format,local_38), str != (char **)0x0)) {
    free(*str);
    free(str[1]);
    free(str);
  }
  return LVar1;
}

Assistant:

static LY_ERR
lyb_parse_prefix_data(struct lylyb_ctx *lybctx, LY_VALUE_FORMAT format, void **prefix_data)
{
    LY_ERR ret = LY_SUCCESS;
    uint8_t count, i;
    struct ly_set *set = NULL;
    struct lyxml_ns *ns = NULL;

    switch (format) {
    case LY_VALUE_XML:
        /* read count */
        lyb_read(&count, 1, lybctx);

        /* read all NS elements */
        LY_CHECK_GOTO(ret = ly_set_new(&set), cleanup);

        for (i = 0; i < count; ++i) {
            ns = calloc(1, sizeof *ns);

            /* prefix */
            LY_CHECK_GOTO(ret = lyb_read_string(&ns->prefix, sizeof(uint16_t), lybctx), cleanup);
            if (!strlen(ns->prefix)) {
                free(ns->prefix);
                ns->prefix = NULL;
            }

            /* namespace */
            LY_CHECK_GOTO(ret = lyb_read_string(&ns->uri, sizeof(uint16_t), lybctx), cleanup);

            LY_CHECK_GOTO(ret = ly_set_add(set, ns, 1, NULL), cleanup);
            ns = NULL;
        }

        *prefix_data = set;
        break;
    case LY_VALUE_JSON:
    case LY_VALUE_LYB:
        /* nothing stored */
        break;
    default:
        LOGINT(lybctx->ctx);
        ret = LY_EINT;
        break;
    }

cleanup:
    if (ret) {
        ly_free_prefix_data(format, set);
        if (ns) {
            free(ns->prefix);
            free(ns->uri);
            free(ns);
        }
    }
    return ret;
}